

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::Assemble
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
           *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *pTVar1;
  TPZCompEl *el;
  int iVar2;
  long lVar3;
  int64_t size;
  TPZCompEl **ppTVar4;
  long *plVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  long nelem;
  long lVar9;
  TPZVec<int> elorder;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  int local_86f4;
  _Rb_tree_header *local_86f0;
  long local_86e8;
  TPZFMatrix<double> *local_86e0;
  TPZMatrix<double> *local_86d8;
  TPZVec<int> local_86d0;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  lVar3 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if ((lVar3 == 0) ||
     (lVar3 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0),
     lVar3 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZFrontStructMatrix<TPZFrontNonSym<double>, double, TPZStructMatrixTBBFlow<STATE>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixTBBFlow<STATE>]"
               ,0x104);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," incompatible types. Aborting...\n",0x21);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
               ,0x145);
  }
  local_86d8 = (TPZMatrix<double> *)
               __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if ((local_86d8 == (TPZMatrix<double> *)0x0) ||
     (local_86e0 = (TPZFMatrix<double> *)
                   __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0)
     , local_86e0 == (TPZFMatrix<double> *)0x0)) {
    __cxa_bad_cast();
  }
  pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  lVar3 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370,pTVar1,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (&local_86b0,(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,EF);
  pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  size = TPZCompMesh::NEquations(pTVar1);
  local_86f4 = 0;
  TPZVec<int>::TPZVec(&local_86d0,size,&local_86f4);
  OrderElement(this);
  if (0 < lVar3) {
    local_86f0 = &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMaterialIds._M_t.
                  _M_impl.super__Rb_tree_header;
    lVar9 = 0;
    local_86e8 = 0;
    do {
      nelem = (long)(this->fElementOrder).fStore[lVar9];
      if (-1 < nelem) {
        ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
        el = *ppTVar4;
        if (el != (TPZCompEl *)0x0) {
          plVar5 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
          if ((plVar5 == (long *)0x0) ||
             (iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5),
             (int)(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMaterialIds._M_t.
                  _M_impl.super__Rb_tree_header._M_node_count == 0)) {
LAB_0136c251:
            (**(code **)(*(long *)el + 0x108))(el,&local_4370,&local_86b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," assemblando elemento frontal ",0x1e);
            poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            AssembleElement(this,el,&local_4370.super_TPZElementMatrix,
                            &local_86b0.super_TPZElementMatrix,local_86d8,local_86e0);
            if (this->f_quiet == 0) {
              local_86f4 = CONCAT31(local_86f4._1_3_,0x2a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)&local_86f4,1);
              if ((local_86e8 * -0x3333333333333333 + 0x1999999999999998U >> 2 |
                  local_86e8 * -0x3333333333333333 << 0x3e) < 0xccccccccccccccd) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,"% Elements assembled ",0x15);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
                std::ostream::flush();
              }
            }
            local_86e8 = local_86e8 + 1;
          }
          else {
            p_Var7 = *(_Base_ptr *)
                      ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.
                              fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header + 8);
            p_Var8 = local_86f0;
            if (p_Var7 != (_Base_ptr)0x0) {
              do {
                if (iVar2 <= (int)*(size_t *)(p_Var7 + 1)) {
                  p_Var8 = (_Rb_tree_header *)p_Var7;
                }
                p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < iVar2];
              } while (p_Var7 != (_Base_ptr)0x0);
              if ((p_Var8 != local_86f0) && ((int)p_Var8->_M_node_count <= iVar2))
              goto LAB_0136c251;
            }
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar3);
  }
  local_86d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_86d0.fStore != (int *)0x0) {
    operator_delete__(local_86d0.fStore);
  }
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_01925e98;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_0185cbd8)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_0185cbd8);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_01925e98;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_0185cbd8)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_0185cbd8);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}